

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operators.hpp
# Opt level: O1

void __thiscall duckdb::FixedDecimalStatistics::Update(FixedDecimalStatistics *this,hugeint_t *val)

{
  long lVar1;
  int64_t iVar2;
  
  lVar1 = (this->min).upper;
  if ((val->upper < lVar1) || (val->lower < (this->min).lower && lVar1 == val->upper)) {
    iVar2 = val->upper;
    (this->min).lower = val->lower;
    (this->min).upper = iVar2;
  }
  lVar1 = (this->max).upper;
  if ((val->upper <= lVar1) && (val->lower <= (this->max).lower || val->upper != lVar1)) {
    return;
  }
  iVar2 = val->upper;
  (this->max).lower = val->lower;
  (this->max).upper = iVar2;
  return;
}

Assistant:

inline bool GreaterThan::Operation(const hugeint_t &left, const hugeint_t &right) {
	return Hugeint::GreaterThan(left, right);
}